

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_node __thiscall pugi::xml_node::prepend_copy(xml_node *this,xml_node *proto)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node_struct *pxVar2;
  xml_node xVar3;
  uint uVar4;
  xml_node_struct *pxVar5;
  uint uVar6;
  xml_node n;
  xml_node local_28;
  xml_node local_20;
  
  uVar4 = 0;
  uVar6 = 0;
  if (proto->_root != (xml_node_struct *)0x0) {
    uVar6 = (uint)proto->_root->header & 0xf;
  }
  pxVar5 = this->_root;
  if (pxVar5 != (xml_node_struct *)0x0) {
    uVar4 = (uint)pxVar5->header & 0xf;
  }
  if (((1 < uVar6) && (0xfffffffd < uVar4 - 3)) && ((uVar6 - 9 < 0xfffffffe || (uVar4 == 1)))) {
    this_00 = *(xml_allocator **)((long)pxVar5 - (pxVar5->header >> 8));
    uVar1 = this_00->_busy_size + 0x40;
    if (uVar1 < 0x7fd9) {
      local_28._root = (xml_node_struct *)this_00->_root;
      pxVar5 = (xml_node_struct *)((long)&(local_28._root)->prev_sibling_c + this_00->_busy_size);
      this_00->_busy_size = uVar1;
    }
    else {
      pxVar5 = (xml_node_struct *)
               impl::anon_unknown_0::xml_allocator::allocate_memory_oob
                         (this_00,0x40,(xml_memory_page **)&local_28);
    }
    if (pxVar5 == (xml_node_struct *)0x0) {
      pxVar5 = (xml_node_struct *)0x0;
    }
    else {
      pxVar5->prev_sibling_c = (xml_node_struct *)0x0;
      pxVar5->next_sibling = (xml_node_struct *)0x0;
      pxVar5->parent = (xml_node_struct *)0x0;
      pxVar5->first_child = (xml_node_struct *)0x0;
      pxVar5->name = (char_t *)0x0;
      pxVar5->value = (char_t *)0x0;
      pxVar5->first_attribute = (xml_attribute_struct *)0x0;
      pxVar5->header = (ulong)uVar6 | ((long)pxVar5 - (long)local_28._root) * 0x100;
    }
    xml_node(&local_28,pxVar5);
    if (local_28._root != (xml_node_struct *)0x0) {
      pxVar5 = this->_root;
      (local_28._root)->parent = pxVar5;
      pxVar2 = pxVar5->first_child;
      xVar3._root = local_28._root;
      if (pxVar2 != (xml_node_struct *)0x0) {
        (local_28._root)->prev_sibling_c = pxVar2->prev_sibling_c;
        xVar3._root = pxVar2;
      }
      (xVar3._root)->prev_sibling_c = local_28._root;
      (local_28._root)->next_sibling = pxVar2;
      pxVar5->first_child = local_28._root;
      impl::anon_unknown_0::node_copy_tree(local_28._root,proto->_root);
      return (xml_node)local_28._root;
    }
  }
  xml_node(&local_20);
  return (xml_node)local_20._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::prepend_copy(const xml_node& proto)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::prepend_node(n._root, _root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}